

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionTestCase.cpp
# Opt level: O3

Logout * anon_unknown.dwarf_52c65e::createLogout
                   (Logout *__return_storage_ptr__,char *sender,char *target,int seq)

{
  undefined1 *this;
  int iVar1;
  Logout *extraout_RAX;
  FieldBase local_80;
  
  FIX42::Logout::Logout(__return_storage_ptr__);
  this = &(__return_storage_ptr__->super_Message).field_0x70;
  fillHeader((Header *)this,sender,target,seq);
  iVar1 = FIX::Message::bodyLength((Message *)__return_storage_ptr__,8,9,10);
  FIX::IntField::IntField((IntField *)&local_80,9,iVar1);
  local_80._vptr_FieldBase = (_func_int **)&PTR__FieldBase_003253c8;
  FIX::FieldMap::setField((FieldMap *)this,&local_80,true);
  FIX::FieldBase::~FieldBase(&local_80);
  iVar1 = FIX::Message::checkSum((Message *)__return_storage_ptr__,10);
  FIX::CheckSumField::CheckSumField((CheckSumField *)&local_80,10,iVar1);
  local_80._vptr_FieldBase = (_func_int **)&PTR__FieldBase_00325560;
  FIX::FieldMap::setField
            ((FieldMap *)&(__return_storage_ptr__->super_Message).field_0xe0,&local_80,true);
  FIX::FieldBase::~FieldBase(&local_80);
  return extraout_RAX;
}

Assistant:

FIX42::Logout createLogout(const char *sender, const char *target, int seq) {
  FIX42::Logout logout;
  fillHeader(logout.getHeader(), sender, target, seq);
  logout.getHeader().setField(BodyLength(logout.bodyLength()));
  logout.getTrailer().setField(CheckSum(logout.checkSum()));
  return logout;
}